

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

void __thiscall
QRhiGles2::trackedBufferBarrier
          (QRhiGles2 *this,QGles2CommandBuffer *cbD,QGles2Buffer *bufD,Access access)

{
  bool bVar1;
  GLbitfield GVar2;
  Command *pCVar3;
  Access in_ECX;
  long in_RDX;
  QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024> *in_RSI;
  Command *cmd;
  Access prevAccess;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  bVar1 = QFlags<QRhiBuffer::UsageFlag>::testFlag
                    ((QFlags<QRhiBuffer::UsageFlag> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                     (UsageFlag)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  if ((bVar1) && (in_ECX != *(Access *)(in_RDX + 0x60))) {
    bVar1 = bufferAccessIsWrite(*(Access *)(in_RDX + 0x60));
    if (bVar1) {
      pCVar3 = QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024>::get(in_RSI);
      pCVar3->cmd = Barrier;
      GVar2 = barriersForBuffer();
      (pCVar3->args).clear.mask = GVar2;
    }
    *(Access *)(in_RDX + 0x60) = in_ECX;
  }
  return;
}

Assistant:

void QRhiGles2::trackedBufferBarrier(QGles2CommandBuffer *cbD, QGles2Buffer *bufD, QGles2Buffer::Access access)
{
    Q_ASSERT(cbD->recordingPass == QGles2CommandBuffer::NoPass); // this is for resource updates only
    if (!bufD->m_usage.testFlag(QRhiBuffer::StorageBuffer))
        return;

    const QGles2Buffer::Access prevAccess = bufD->usageState.access;
    if (access == prevAccess)
        return;

    if (bufferAccessIsWrite(prevAccess)) {
        // Generating the minimal barrier set is way too complicated to do
        // correctly (prevAccess is overwritten so we won't have proper
        // tracking across multiple passes) so setting all barrier bits will do
        // for now.
        QGles2CommandBuffer::Command &cmd(cbD->commands.get());
        cmd.cmd = QGles2CommandBuffer::Command::Barrier;
        cmd.args.barrier.barriers = barriersForBuffer();
    }

    bufD->usageState.access = access;
}